

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_snoop(CHAR_DATA *ch,char *argument)

{
  DESCRIPTOR_DATA *pDVar1;
  bool bVar2;
  int iVar3;
  CHAR_DATA *pCVar4;
  DESCRIPTOR_DATA **ppDVar5;
  DESCRIPTOR_DATA *pDVar6;
  char *txt;
  char arg [4608];
  char buf [4608];
  
  one_argument(argument,arg);
  if (arg[0] == '\0') {
    txt = "Snoop whom?\n\r";
  }
  else {
    pCVar4 = get_char_world(ch,arg);
    if (pCVar4 == (CHAR_DATA *)0x0) {
      txt = "They aren\'t here.\n\r";
    }
    else if (pCVar4->desc == (DESCRIPTOR_DATA *)0x0) {
      txt = "No descriptor to snoop.\n\r";
    }
    else {
      if (pCVar4 == ch) {
        send_to_char("Cancelling all snoops.\n\r",ch);
        iVar3 = get_trust(ch);
        wiznet("$N stops being such a snoop.",ch,(OBJ_DATA *)0x0,0xe,0xc,iVar3);
        ppDVar5 = &descriptor_list;
        while (ppDVar5 = &((DESCRIPTOR_DATA *)ppDVar5)->next->next,
              (DESCRIPTOR_DATA *)ppDVar5 != (DESCRIPTOR_DATA *)0x0) {
          if (((DESCRIPTOR_DATA *)ppDVar5)->snoop_by == ch->desc) {
            ((DESCRIPTOR_DATA *)ppDVar5)->snoop_by = (DESCRIPTOR_DATA *)0x0;
          }
        }
        return;
      }
      if (pCVar4->desc->snoop_by == (DESCRIPTOR_DATA *)0x0) {
        if (((pCVar4->in_room->room_flags[0] & 0x4000) == 0) || (0x3b < ch->level)) {
          bVar2 = is_room_owner(ch,pCVar4->in_room);
          if ((bVar2) ||
             (((ch->in_room == pCVar4->in_room || (bVar2 = room_is_private(pCVar4->in_room), !bVar2)
               ) || (0x3b < ch->level)))) {
            if ((pCVar4->level < ch->level) && ((pCVar4->comm[0] & 0x1000000) == 0)) {
              pDVar1 = ch->desc;
              pDVar6 = pDVar1;
              if (pDVar1 == (DESCRIPTOR_DATA *)0x0) {
LAB_002cab90:
                pCVar4->desc->snoop_by = pDVar1;
                bVar2 = is_npc(ch);
                sprintf(buf,"$N starts snooping on %s",(&pCVar4->name)[(ulong)bVar2 * 4]);
                iVar3 = get_trust(ch);
                wiznet(buf,ch,(OBJ_DATA *)0x0,0xe,0xc,iVar3);
                txt = "Ok.\n\r";
              }
              else {
                do {
                  pDVar6 = pDVar6->snoop_by;
                  if (pDVar6 == (DESCRIPTOR_DATA *)0x0) goto LAB_002cab90;
                } while ((pDVar6->character != pCVar4) && (pDVar6->original != pCVar4));
                txt = "No snoop loops.\n\r";
              }
            }
            else {
              txt = "You failed.\n\r";
            }
          }
          else {
            txt = "That character is in a private room.\n\r";
          }
        }
        else {
          txt = "Access denied.\n\r";
        }
      }
      else {
        txt = "Busy already.\n\r";
      }
    }
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_snoop(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	DESCRIPTOR_DATA *d;
	CHAR_DATA *victim;
	char buf[MAX_STRING_LENGTH];

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Snoop whom?\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim->desc == nullptr)
	{
		send_to_char("No descriptor to snoop.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("Cancelling all snoops.\n\r", ch);
		wiznet("$N stops being such a snoop.", ch, nullptr, WIZ_SNOOPS, WIZ_SECURE, get_trust(ch));

		for (d = descriptor_list; d != nullptr; d = d->next)
		{
			if (d->snoop_by == ch->desc)
				d->snoop_by = nullptr;
		}

		return;
	}

	if (victim->desc->snoop_by != nullptr)
	{
		send_to_char("Busy already.\n\r", ch);
		return;
	}

	if (IS_SET(victim->in_room->room_flags, ROOM_IMP_ONLY) && ch->level < 60)
	{
		send_to_char("Access denied.\n\r", ch);
		return;
	}

	if (!is_room_owner(ch, victim->in_room)
		&& ch->in_room != victim->in_room
		&& room_is_private(victim->in_room)
		&& ch->level < 60)
	{
		send_to_char("That character is in a private room.\n\r", ch);
		return;
	}

	if (victim->level >= ch->level || IS_SET(victim->comm, COMM_SNOOP_PROOF))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (ch->desc != nullptr)
	{
		for (d = ch->desc->snoop_by; d != nullptr; d = d->snoop_by)
		{
			if (d->character == victim || d->original == victim)
			{
				send_to_char("No snoop loops.\n\r", ch);
				return;
			}
		}
	}

	victim->desc->snoop_by = ch->desc;

	sprintf(buf, "$N starts snooping on %s", (is_npc(ch) ? victim->short_descr : victim->name));
	wiznet(buf, ch, nullptr, WIZ_SNOOPS, WIZ_SECURE, get_trust(ch));

	send_to_char("Ok.\n\r", ch);
}